

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

int userkey_parse_line_counter(char *text)

{
  ulong uVar1;
  unsigned_long ul;
  char *endptr;
  char *text_local;
  
  endptr = text;
  uVar1 = strtoul(text,(char **)&ul,10);
  if (((*endptr == '\0') || (*(char *)ul != '\0')) || (0x1554 < uVar1)) {
    text_local._4_4_ = -1;
  }
  else {
    text_local._4_4_ = (int)uVar1;
  }
  return text_local._4_4_;
}

Assistant:

static int userkey_parse_line_counter(const char *text)
{
    char *endptr;
    unsigned long ul = strtoul(text, &endptr, 10);
    if (*text && !*endptr && ul < MAX_KEY_BLOB_LINES)
        return ul;
    else
        return -1;
}